

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void avePooling(pBox *pbox,pBox *Matrix,int kernelSize,int stride)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  mydataFmt *pmVar5;
  uint uVar6;
  ostream *poVar7;
  mydataFmt *pmVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  mydataFmt *pmVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int kernelRow;
  ulong uVar18;
  mydataFmt *pmVar19;
  ulong uVar20;
  float fVar21;
  
  pmVar5 = pbox->pdata;
  if (pmVar5 != (mydataFmt *)0x0) {
    iVar1 = pbox->width;
    if (((iVar1 - kernelSize) % stride == 0) &&
       (iVar2 = pbox->height, (iVar2 - kernelSize) % stride == 0)) {
      pmVar8 = Matrix->pdata;
      uVar3 = Matrix->height;
      uVar20 = 0;
      if (0 < kernelSize) {
        uVar20 = (ulong)(uint)kernelSize;
      }
      uVar11 = 0;
      if (0 < (int)uVar3) {
        uVar11 = (ulong)uVar3;
      }
      iVar10 = 0;
      for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
        pmVar12 = pmVar5 + iVar10;
        uVar4 = Matrix->width;
        uVar6 = uVar4;
        if ((int)uVar4 < 1) {
          uVar6 = 0;
        }
        for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
          uVar13 = 0;
          uVar14 = (ulong)(uint)pbox->channel;
          if (pbox->channel < 1) {
            uVar14 = uVar13;
          }
          for (uVar9 = 0; uVar9 != uVar14; uVar9 = uVar9 + 1) {
            pmVar19 = pmVar12 + (int)uVar13;
            fVar21 = 0.0;
            for (uVar18 = 0; uVar18 != uVar20; uVar18 = uVar18 + 1) {
              for (uVar16 = 0; (uint)kernelSize != uVar16; uVar16 = uVar16 + 1) {
                fVar21 = fVar21 + pmVar19[uVar16];
              }
              pmVar19 = pmVar19 + iVar1;
            }
            pmVar8[(int)(uVar4 * uVar3 * (int)uVar9)] = fVar21 / (float)(kernelSize * kernelSize);
            uVar13 = (ulong)(uint)((int)uVar13 + iVar2 * iVar1);
          }
          pmVar8 = pmVar8 + 1;
          pmVar12 = pmVar12 + stride;
        }
        iVar10 = iVar10 + stride * iVar1;
      }
    }
    return;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"the feature2Matrix pbox is NULL!!");
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void avePooling(const pBox *pbox, pBox *Matrix, int kernelSize, int stride) {
    if (pbox->pdata == NULL) {
        cout << "the feature2Matrix pbox is NULL!!" << endl;
        return;
    }
    mydataFmt *p = Matrix->pdata;
    mydataFmt *pIn;
    mydataFmt *ptemp;
    mydataFmt sumNum = 0;
    if ((pbox->width - kernelSize) % stride == 0 && (pbox->height - kernelSize) % stride == 0) {
        for (int row = 0; row < Matrix->height; row++) {
            for (int col = 0; col < Matrix->width; col++) {
                pIn = pbox->pdata + row * stride * pbox->width + col * stride;

                for (int channel = 0; channel < pbox->channel; channel++) {

                    ptemp = pIn + channel * pbox->height * pbox->width;
                    sumNum = 0;
                    for (int kernelRow = 0; kernelRow < kernelSize; kernelRow++) {
                        for (int i = 0; i < kernelSize; i++) {
                            sumNum += *(ptemp + i + kernelRow * pbox->width);
                        }
                    }
                    *(p + channel * Matrix->height * Matrix->width) = sumNum / (kernelSize * kernelSize);
                }
                p++;
            }
        }
    }
}